

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3ExprCoveredByIndex(Expr *pExpr,int iCur,Index *pIdx)

{
  uint uVar1;
  IdxCover xcov;
  Walker local_48;
  Index *local_18;
  int local_10;
  
  local_48.pParse = (Parse *)0x0;
  local_48.xSelectCallback = (_func_int_Walker_ptr_Select_ptr *)0x0;
  local_48.xSelectCallback2 = (_func_void_Walker_ptr_Select_ptr *)0x0;
  local_48.walkerDepth = 0;
  local_48.eCode = 0;
  local_48._38_2_ = 0;
  local_48.u.pNC = (NameContext *)&local_18;
  local_48.xExprCallback = exprIdxCover;
  if (pExpr == (Expr *)0x0) {
    uVar1 = 1;
  }
  else {
    local_18 = pIdx;
    local_10 = iCur;
    walkExpr(&local_48,pExpr);
    uVar1 = (uint)(local_48.eCode == 0);
  }
  return uVar1;
}

Assistant:

SQLITE_PRIVATE int sqlite3ExprCoveredByIndex(
  Expr *pExpr,        /* The index to be tested */
  int iCur,           /* The cursor number for the corresponding table */
  Index *pIdx         /* The index that might be used for coverage */
){
  Walker w;
  struct IdxCover xcov;
  memset(&w, 0, sizeof(w));
  xcov.iCur = iCur;
  xcov.pIdx = pIdx;
  w.xExprCallback = exprIdxCover;
  w.u.pIdxCover = &xcov;
  sqlite3WalkExpr(&w, pExpr);
  return !w.eCode;
}